

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-home-notice.c
# Opt level: O2

void borg_notice_home_dupe(borg_item_conflict *item,_Bool check_sval,wchar_t i)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  borg_item_conflict *pbVar6;
  
  _Var1 = borg_ego_has_random_power(e_info + item->ego_idx);
  if ((!_Var1) && (item->needs_ident == false)) {
    iVar2 = item->iqty - 1;
    uVar4 = 0;
    uVar3 = (ulong)(uint)i;
    if (i < L'\x01') {
      uVar3 = uVar4;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      if (uVar5 < z_info->store_inven_max) {
        pbVar6 = (borg_item_conflict *)((borg_shops[7].ware)->desc + uVar4);
      }
      else {
        pbVar6 = borg_items +
                 (int)(((uint)z_info->pack_size - (uint)z_info->store_inven_max) + (int)uVar5);
      }
      if ((((pbVar6->iqty != '\0') && (pbVar6->aware == true)) && (item->tval == pbVar6->tval)) &&
         (((!check_sval || (item->sval == pbVar6->sval)) && (item->art_idx == pbVar6->art_idx)))) {
        iVar2 = iVar2 + (uint)(item->ego_idx == pbVar6->ego_idx);
      }
      uVar4 = uVar4 + 0x388;
    }
    num_duplicate_items =
         num_duplicate_items + ((short)iVar2 - (ushort)(iVar2 != 0 && item->tval == '\x15'));
  }
  return;
}

Assistant:

static void borg_notice_home_dupe(borg_item *item, bool check_sval, int i)
{
    /* eventually check for power overlap... armor of resistance is same as weak
     * elvenkind.*/
    /*  two armors of elvenkind that resist poison is a dupe.  AJG*/

    int              dupe_count, x;
    borg_item       *item2;
    struct ego_item *e_ptr = &e_info[item->ego_idx];

    /* check for a duplicate.  */
    /* be carefull about extra powers (elvenkind/magi) */
    if (borg_ego_has_random_power(e_ptr))
        return;

    /* if it isn't identified, it isn't duplicate */
    if (item->needs_ident)
        return;

    /* if this is a stack of items then all after the first are a */
    /* duplicate */
    dupe_count = item->iqty - 1;

    /* Look for other items before this one that are the same */
    for (x = 0; x < i; x++) {
        if (x < z_info->store_inven_max)
            item2 = &borg_shops[BORG_HOME].ware[x];
        else
            /* Check what the borg has on as well.*/
            item2 = &borg_items[((x - z_info->store_inven_max) + INVEN_WIELD)];

        /* skip zero quantity or unknown items */
        if (!item2->iqty || !item2->aware)
            continue;

        /* if everything matches it is a duplicate item */
        /* Note that we only check sval on certain items.  This */
        /* is because, for example, two pairs of dragon armor */
        /* are not the same unless their subtype (color) matches */
        /* but a defender is a defender even if one is a dagger and */
        /* one is a mace */
        if ((item->tval == item2->tval)
            && (check_sval ? (item->sval == item2->sval) : true)
            && (item->art_idx == item2->art_idx)
            && (item->ego_idx == item2->ego_idx)) {
            dupe_count++;
        }
    }

    /* there can be one dupe of rings because there are two ring slots. */
    if (item->tval == TV_RING && dupe_count)
        dupe_count--;

    /* Add this items count to the total duplicate count */
    num_duplicate_items += dupe_count;
}